

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O3

int quicly_loss_detect_loss
              (quicly_loss_t *loss,int64_t now,uint32_t max_ack_delay,int is_1rtt_only,
              quicly_loss_on_detect_cb on_loss_detected)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  quicly_loss_on_detect_cb p_Var4;
  int iVar5;
  anon_union_24_13_c7673ae4_for_data *paVar6;
  long lVar7;
  long lVar8;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_iter_t local_60;
  ulong local_48;
  quicly_sentmap_t *local_40;
  quicly_loss_on_detect_cb local_38;
  
  uVar1 = (loss->rtt).smoothed;
  uVar2 = (loss->rtt).latest;
  if (uVar1 < uVar2) {
    uVar1 = uVar2;
  }
  loss->loss_time = 0x7fffffffffffffff;
  local_38 = on_loss_detected;
  iVar5 = quicly_loss_init_sentmap_iter(loss,&local_60,now,max_ack_delay,0);
  p_Var4 = local_38;
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((local_60.p)->acked == quicly_sentmap__type_packet) {
    local_48 = (ulong)(uVar1 * 9 + 7 >> 3);
    lVar8 = now - local_48;
    local_40 = &loss->sentmap;
    do {
      paVar6 = &(local_60.p)->data;
      lVar3 = ((local_60.p)->data).stream.stream_id;
      if (lVar3 == -1) {
        if (is_1rtt_only == 0) {
          iVar5 = quicly_loss_init_sentmap_iter(loss,&local_60,now,max_ack_delay,0);
          if (iVar5 != 0) {
            return iVar5;
          }
          if ((local_60.p)->acked != quicly_sentmap__type_packet) break;
          paVar6 = &(local_60.p)->data;
        }
LAB_0013153f:
        lVar8 = (paVar6->packet).sent_at;
        if (lVar8 == 0x7fffffffffffffff) {
          return 0;
        }
        while( true ) {
          if (loss->largest_acked_packet_plus1[(paVar6->packet).ack_epoch] <=
              (paVar6->packet).packet_number + 1) {
            return 0;
          }
          if ((paVar6->packet).cc_bytes_in_flight != 0) {
            if (now < (long)(lVar8 + local_48)) {
              loss->loss_time = lVar8 + local_48;
              return 0;
            }
            __assert_fail("now < sent->sent_at + delay_until_lost",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/loss.c"
                          ,0x5e,
                          "int quicly_loss_detect_loss(quicly_loss_t *, int64_t, uint32_t, int, quicly_loss_on_detect_cb)"
                         );
          }
          quicly_sentmap_skip(&local_60);
          if ((local_60.p)->acked != quicly_sentmap__type_packet) break;
          lVar8 = ((local_60.p)->data).packet.sent_at;
          paVar6 = &(local_60.p)->data;
          if (lVar8 == 0x7fffffffffffffff) {
            return 0;
          }
        }
        break;
      }
      if ((lVar3 < (long)(loss->largest_acked_packet_plus1[((local_60.p)->data).packet.ack_epoch] -
                         1)) &&
         ((lVar7 = loss->largest_acked_packet_plus1[((local_60.p)->data).packet.ack_epoch] - 4,
          lVar3 <= lVar7 || (((local_60.p)->data).packet.sent_at <= lVar8)))) {
        if (((local_60.p)->data).packet.cc_bytes_in_flight == 0) goto LAB_001314f1;
        (*p_Var4)(loss,(quicly_sent_packet_t *)paVar6,SUB14(lVar7 < lVar3,0));
        iVar5 = quicly_sentmap_update(local_40,&local_60,QUICLY_SENTMAP_EVENT_LOST);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      else {
        if (is_1rtt_only != 0) goto LAB_0013153f;
LAB_001314f1:
        quicly_sentmap_skip(&local_60);
      }
    } while ((local_60.p)->acked == quicly_sentmap__type_packet);
  }
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
}

Assistant:

int quicly_loss_detect_loss(quicly_loss_t *loss, int64_t now, uint32_t max_ack_delay, int is_1rtt_only,
                            quicly_loss_on_detect_cb on_loss_detected)
{
    /* This function ensures that the value returned in loss_time is when the next application timer should be set for loss
     * detection. if no timer is required, loss_time is set to INT64_MAX. */

    const uint32_t delay_until_lost = ((loss->rtt.latest > loss->rtt.smoothed ? loss->rtt.latest : loss->rtt.smoothed) * 9 + 7) / 8;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    loss->loss_time = INT64_MAX;

    if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
        return ret;

    /* Mark packets as lost if they are smaller than the largest_acked and outside either time-threshold or packet-threshold
     * windows. Once marked as lost, cc_bytes_in_flight becomes zero. */
    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        int64_t largest_acked_signed = loss->largest_acked_packet_plus1[sent->ack_epoch] - 1;
        if ((int64_t)sent->packet_number < largest_acked_signed &&
            (sent->sent_at <= now - delay_until_lost ||                                                      /* time threshold */
             (int64_t)sent->packet_number <= largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD)) { /* packet threshold */
            if (sent->cc_bytes_in_flight != 0) {
                on_loss_detected(loss, sent,
                                 (int64_t)sent->packet_number > largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD);
                if ((ret = quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_LOST)) != 0)
                    return ret;
            } else {
                quicly_sentmap_skip(&iter);
            }
        } else {
            /* When only one PN space is active, it is possible to stop looking for packets that have to be considered lost and
             * continue on to calculating the loss time. Otherwise, iterate through the entire sentmap. */
            if (is_1rtt_only)
                break;
            quicly_sentmap_skip(&iter);
        }
    }

    if (!is_1rtt_only) {
        if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
            return ret;
        sent = quicly_sentmap_get(&iter);
    }

    /* schedule time-threshold alarm if there is a packet outstanding that is smaller than largest_acked */
    while (sent->sent_at != INT64_MAX && sent->packet_number + 1 < loss->largest_acked_packet_plus1[sent->ack_epoch]) {
        if (sent->cc_bytes_in_flight != 0) {
            assert(now < sent->sent_at + delay_until_lost);
            loss->loss_time = sent->sent_at + delay_until_lost;
            break;
        }
        quicly_sentmap_skip(&iter);
        sent = quicly_sentmap_get(&iter);
    }

    return 0;
}